

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseEngine.cpp
# Opt level: O2

impl_schema_type *
PrepareSchema(impl_schema_type *__return_storage_ptr__,api_schema_type *raw_schema)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>
  pStack_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var4 = (raw_schema->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(raw_schema->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>
    ::pair(&pStack_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>
            *)(p_Var4 + 1));
    if ((ulong)pStack_58.second < 4) {
      mVar2 = *(mapped_type *)(&DAT_00158bf0 + (ulong)pStack_58.second * 4);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
               ::operator[](__return_storage_ptr__,&pStack_58.first);
      *pmVar3 = mVar2;
    }
    std::__cxx11::string::~string((string *)&pStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

database::impl_schema_type PrepareSchema(const database::api_schema_type& raw_schema)
{
  database::impl_schema_type schema;
  std::for_each(raw_schema.begin(),raw_schema.end(),[&](auto pair) {
    switch (pair.second)
    {
      case database::integer: schema[pair.first] = database::numeric; break;
      case database::string: schema[pair.first] = database::non_numeric; break;
      case database::boolean: schema[pair.first] = database::non_numeric; break;
      case database::date: schema[pair.first] = database::numeric; break;
      default: break;
    }
  });
  return schema;
}